

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

bool __thiscall
pegmatite::ASTString::construct
          (ASTString *this,InputRange *r,ASTStack *param_2,ErrorReporter *param_3)

{
  Input *this_00;
  Index IVar1;
  bool bVar2;
  char32_t cVar3;
  ulong uVar4;
  Index n;
  stringstream stream;
  string local_1d8;
  undefined7 uStack_1d7;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  this_00 = (r->start).it.buffer;
  n = (r->start).it.idx;
  IVar1 = (r->finish).it.idx;
  uVar4 = (ulong)(r->finish).it.buffer ^ (ulong)this_00;
  if (n != IVar1 || uVar4 != 0) {
    do {
      if ((n < this_00->buffer_start) || (this_00->buffer_end <= n)) {
        cVar3 = Input::slowCharacterLookup(this_00,n);
        local_1d8 = SUB41(cVar3,0);
      }
      else {
        local_1d8 = SUB41(this_00->buffer[n - this_00->buffer_start],0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
      bVar2 = IVar1 - 1 != n;
      n = n + 1;
    } while (bVar2 || uVar4 != 0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->super_string,&local_1d8);
  if ((long *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
    operator_delete((long *)CONCAT71(uStack_1d7,local_1d8),local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return true;
}

Assistant:

bool ASTString::construct(const pegmatite::InputRange &r, pegmatite::ASTStack &,
                          const ErrorReporter &)
{
	std::stringstream stream;
	std::for_each(r.begin(),
	         r.end(),
	         [&](char32_t c) {stream << static_cast<char>(c);});
	this->std::string::operator=(stream.str());

	return true;
}